

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractContentContext.cpp
# Opt level: O1

void __thiscall
AbstractContentContext::AbstractContentContext
          (AbstractContentContext *this,DocumentContext *inDocumentContext)

{
  _Rb_tree_header *p_Var1;
  
  this->_vptr_AbstractContentContext = (_func_int **)&PTR__AbstractContentContext_003a9d48;
  PrimitiveObjectsWriter::PrimitiveObjectsWriter(&this->mPrimitiveWriter,(IByteWriter *)0x0);
  GraphicStateStack::GraphicStateStack(&this->mGraphicStack);
  p_Var1 = &(this->mListeners)._M_t._M_impl.super__Rb_tree_header;
  (this->mListeners)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->mListeners)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->mListeners)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->mListeners)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->mListeners)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->mDocumentContext = inDocumentContext;
  this->mCurrentStatusCode = eSuccess;
  return;
}

Assistant:

AbstractContentContext::AbstractContentContext(PDFHummus::DocumentContext* inDocumentContext)
{
	mDocumentContext = inDocumentContext;
	mCurrentStatusCode = eSuccess;
}